

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_crl.cpp
# Opt level: O0

bool LoadCRLFromFile(char *szFile,CertificateList *crl)

{
  LoadResult LVar1;
  ostream *poVar2;
  LoadResult result;
  CertificateList *crl_local;
  char *szFile_local;
  
  LVar1 = LoadObjectFromFile<CertificateList>(szFile,crl);
  switch(LVar1) {
  case Success:
    return true;
  case FileOpenFail:
    poVar2 = std::operator<<((ostream *)&std::cout,"Cannot open input file: ");
    poVar2 = std::operator<<(poVar2,szFile);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    break;
  case ParseError:
    poVar2 = std::operator<<((ostream *)&std::cout,"Malformed CRL - parsing error: ");
    poVar2 = std::operator<<(poVar2,szFile);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    break;
  case DecodeError:
    poVar2 = std::operator<<((ostream *)&std::cout,"Malformed CRL: ");
    poVar2 = std::operator<<(poVar2,szFile);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return false;
}

Assistant:

bool LoadCRLFromFile(const char* szFile, CertificateList& crl)
{
    LoadResult result = LoadObjectFromFile(szFile, crl);

    switch (result)
    {
    case LoadResult::Success:
        return true;

    case LoadResult::DecodeError:
        std::cout << "Malformed CRL: " << szFile << std::endl;
        break;

    case LoadResult::ParseError:
        std::cout << "Malformed CRL - parsing error: " << szFile << std::endl;
        break;

    case LoadResult::FileOpenFail:
        std::cout << "Cannot open input file: " << szFile << std::endl;
        break;
    
    }

    return false;
}